

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpInputStream::Message> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readMessage(HttpInputStreamImpl *this)

{
  Coroutine<kj::HttpInputStream::Message> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  PromiseArenaMember *node;
  long lVar1;
  char *ptr;
  ulong uVar2;
  long *plVar3;
  SourceLocation location;
  bool bVar4;
  coroutine_handle<void> coroutine;
  undefined8 *puVar5;
  StringPtr *header;
  undefined8 *puVar6;
  long lVar7;
  undefined8 in_RSI;
  DebugExpression<bool> _kjCondition;
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  undefined4 local_40 [2];
  undefined4 local_38;
  
  coroutine._M_fr_ptr = operator_new(0x4b8);
  *(code **)coroutine._M_fr_ptr = readMessage;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readMessage;
  this_00 = (Coroutine<kj::HttpInputStream::Message> *)((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a8) = in_RSI;
  body.disposer = (Disposer *)anon_var_dwarf_ad98c1;
  body.ptr = (AsyncInputStream *)s_readMessage_0058988d;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006dab10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006dab58;
  location.function = "readMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5af;
  location.columnNumber = 0x18;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x4a0);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006dab10;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006dab58;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  readMessageHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x250);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x4b0) = 0;
  bVar4 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (bVar4) {
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
  await_resume((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
               ((long)coroutine._M_fr_ptr + 0x448),__return_storage_ptr__);
  if ((*(char *)((long)coroutine._M_fr_ptr + 0x400) == '\x01') &&
     (*(int *)((long)coroutine._M_fr_ptr + 0x408) - 1U < 2)) {
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x408) = 0;
  }
  if (*(char *)((long)coroutine._M_fr_ptr + 0x268) == '\x01') {
    Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x270));
  }
  kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
  node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
  if (node != (PromiseArenaMember *)0x0) {
    (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  _kjCondition.value =
       ((OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
       ((long)coroutine._M_fr_ptr + 0x448))->tag == 1;
  if (_kjCondition.value) {
    lVar1 = *(long *)((long)coroutine._M_fr_ptr + 0x4a8);
    ptr = *(char **)((long)coroutine._M_fr_ptr + 0x450);
    uVar2 = *(ulong *)((long)coroutine._M_fr_ptr + 0x458);
    lVar7 = lVar1;
    if (*(long *)(lVar1 + 0x58) != 0) {
      puVar6 = *(undefined8 **)(lVar1 + 0x50);
      puVar5 = puVar6 + *(long *)(lVar1 + 0x58) * 2;
      do {
        *puVar6 = "";
        puVar6[1] = 1;
        puVar6 = puVar6 + 2;
      } while (puVar6 != puVar5);
      lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0x4a8);
    }
    *(undefined8 *)(lVar7 + 0x70) = *(undefined8 *)(lVar7 + 0x68);
    if ((uVar2 < 2) || (ptr[uVar2 - 1] != '\n')) {
      _kjCondition.value = false;
    }
    else {
      lVar7 = uVar2 - 1;
      if (ptr[uVar2 - 2] == '\r') {
        lVar7 = uVar2 - 2;
      }
      ptr[~(ulong)(ptr[uVar2 - 2] == '\r') + uVar2] = '\0';
      _kjCondition.value = HttpHeaders::parseHeaders((HttpHeaders *)(lVar1 + 0x48),ptr,ptr + lVar7);
      if (_kjCondition.value) {
        local_40[0] = 1;
        local_38 = 0;
        getEntityBody((HttpInputStreamImpl *)&body,
                      (RequestOrResponse)*(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a8),
                      (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x1,(uint)local_40,
                      (HttpHeaders *)0x0);
        local_40[0] = 0;
        *(HttpHeaders **)((long)coroutine._M_fr_ptr + 0x488) = (HttpHeaders *)(lVar1 + 0x48);
        *(Disposer **)((long)coroutine._M_fr_ptr + 0x490) = body.disposer;
        *(AsyncInputStream **)((long)coroutine._M_fr_ptr + 0x498) = body.ptr;
        body.ptr = (AsyncInputStream *)0x0;
        kj::_::Coroutine<kj::HttpInputStream::Message>::fulfill
                  (this_00,(FixVoid<kj::HttpInputStream::Message> *)
                           ((long)coroutine._M_fr_ptr + 0x488));
        plVar3 = *(long **)((long)coroutine._M_fr_ptr + 0x498);
        if (plVar3 != (long *)0x0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0x498) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x490))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x490),
                     (long)plVar3 + *(long *)(*plVar3 + -0x10));
        }
        *(undefined8 *)coroutine._M_fr_ptr = 0;
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0x4b0) = 1;
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[12]>
              ((Fault *)&body,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x5b4,FAILED,"headers.tryParse(text)","_kjCondition,\"bad message\"",&_kjCondition,
               (char (*) [12])"bad message");
    kj::_::Debug::Fault::fatal((Fault *)&body);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[12]>
            ((Fault *)&body,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x5b1,FAILED,"textOrError.is<kj::ArrayPtr<char>>()","_kjCondition,\"bad message\"",
             &_kjCondition,(char (*) [12])"bad message");
  kj::_::Debug::Fault::fatal((Fault *)&body);
}

Assistant:

kj::Promise<Message> readMessage() override {
    auto textOrError = co_await readMessageHeaders();
    KJ_REQUIRE(textOrError.is<kj::ArrayPtr<char>>(), "bad message");
    auto text = textOrError.get<kj::ArrayPtr<char>>();
    headers.clear();
    KJ_REQUIRE(headers.tryParse(text), "bad message");
    auto body = getEntityBody(HttpInputStreamImpl::RESPONSE, HttpMethod::GET, 0, headers);

    co_return { headers, kj::mv(body) };
  }